

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

dma_memory ixy::memory_allocate_dma(size_t size,bool require_contiguous)

{
  uint __val;
  uintptr_t uVar1;
  __pid_t __val_00;
  int iVar2;
  int iVar3;
  __off_t _Var4;
  ssize_t sVar5;
  _Alloc_hider _Var6;
  ulong uVar7;
  dma_memory dVar8;
  undefined1 local_f0 [32];
  uintptr_t phy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  path path;
  string local_68;
  string local_48;
  
  path._M_pathname._M_string_length = (size_type)anon_var_dwarf_38e87;
  debug<ixy::Pair<ixy::None,char_const*>>
            ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp",
             0xc,"memory_allocate_dma",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&path);
  uVar7 = size + 0x1fffff & 0xffffffffffe00000;
  if (0x200000 < uVar7 && require_contiguous) {
    path._M_pathname._M_string_length = (size_type)anon_var_dwarf_394e0;
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x15,"memory_allocate_dma",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&path);
  }
  __val = huge_pg_id;
  LOCK();
  huge_pg_id = huge_pg_id + 1;
  UNLOCK();
  __val_00 = getpid();
  std::__cxx11::to_string(&local_48,__val_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&phy,
                 "/mnt/huge/ixy-",&local_48);
  std::operator+(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&phy
                 ,"-");
  std::__cxx11::to_string(&local_68,__val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                 &local_b0,&local_68);
  std::filesystem::__cxx11::path::path(&path,(string_type *)local_f0,auto_format);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&phy);
  std::__cxx11::string::~string((string *)&local_48);
  iVar2 = open(path._M_pathname._M_dataplus._M_p,0x42,0x1c0);
  if (iVar2 == -1) {
    local_f0._8_8_ = "failed to open hugetlbfs file, check that /mnt/huge is mounted";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x1e,"memory_allocate_dma",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f0)
    ;
  }
  iVar3 = ftruncate(iVar2,uVar7);
  if (iVar3 == -1) {
    local_f0._8_8_ = "failed to allocate huge page memory, check hugetlbfs configuration";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x22,"memory_allocate_dma",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f0)
    ;
  }
  dVar8.virt = (pointer)mmap((void *)0x0,uVar7,3,0x40001,iVar2,0);
  if (dVar8.virt == (pointer)0xffffffffffffffff) {
    local_f0._8_8_ = "failed to mmap huge page";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x28,"memory_allocate_dma",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f0)
    ;
  }
  iVar3 = mlock(dVar8.virt,uVar7);
  if (iVar3 == -1) {
    local_f0._8_8_ = "disable swap for DMA memory";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x2d,"memory_allocate_dma",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f0)
    ;
  }
  close(iVar2);
  unlink(path._M_pathname._M_dataplus._M_p);
  local_b0._M_dataplus._M_p = dVar8.virt;
  uVar7 = sysconf(0x1e);
  iVar2 = open("/proc/self/pagemap",0);
  if (iVar2 == -1) {
    local_f0._8_8_ = "failed to open pagemap";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
               ,0x19,"virt_to_phys",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f0);
  }
  uVar7 = uVar7 & 0xffffffff;
  _Var4 = lseek(iVar2,((ulong)dVar8.virt / uVar7) * 8,0);
  if (_Var4 == -1) {
    local_f0._8_8_ = "failed to lseek pagemap";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
               ,0x1e,"virt_to_phys",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f0);
  }
  phy = 0;
  sVar5 = read(iVar2,&phy,8);
  if (sVar5 == -1) {
    local_f0._8_8_ = "failed to translate address";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
               ,0x23,"virt_to_phys",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f0);
  }
  close(iVar2);
  uVar1 = phy;
  _Var6._M_p = dVar8.virt;
  if (phy == 0) {
    local_f0._8_8_ = "failed to translate virtual address ";
    local_f0._24_8_ = " to physical address";
    local_f0._16_8_ = &local_b0;
    error<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,void*const&>,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
               ,0x29,"virt_to_phys",
               (LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_void_*const_&>,_const_char_*>_>
                *)local_f0);
    _Var6._M_p = local_b0._M_dataplus._M_p;
  }
  std::filesystem::__cxx11::path::~path(&path);
  dVar8.phy = (ulong)_Var6._M_p % uVar7 + (uVar1 & 0x7fffffffffffff) * uVar7;
  return dVar8;
}

Assistant:

auto memory_allocate_dma(size_t size, bool require_contiguous) -> dma_memory {
    debug("allocating dma memory via huge page");
    // round up to multiples of 2 MB if necessary, this is the wasteful part
    // this could be fixed by co-locating allocations on the same page until a request would be too large
    // when fixing this: make sure to align on 128 byte boundaries (82599 dma requirement)
    if (size % HUGE_PAGE_SIZE) {
        size = ((size >> HUGE_PAGE_BITS) + 1) << HUGE_PAGE_BITS;
    }
    if (require_contiguous && size > HUGE_PAGE_SIZE) {
        // this is the place to implement larger contiguous physical mappings if that's ever needed
        error("could not map physically contiguous memory");
    }
    // unique filename, C11 stdatomic.h requires a too recent gcc, we want to support gcc 4.8
    uint32_t id = __sync_fetch_and_add(&huge_pg_id, 1);

    fs::path path{"/mnt/huge/ixy-" + std::to_string(getpid()) + "-" + std::to_string(id)};
    int fd = open(path.c_str(), O_CREAT | O_RDWR, S_IRWXU);

    if (fd == -1) {
        error("failed to open hugetlbfs file, check that /mnt/huge is mounted");
    }

    if (ftruncate(fd, static_cast<off_t>(size)) == -1) {
        error("failed to allocate huge page memory, check hugetlbfs configuration");
    }

    void *virt_addr = mmap(nullptr, size, PROT_READ | PROT_WRITE, MAP_SHARED | MAP_HUGETLB, fd, 0);

    if (virt_addr == MAP_FAILED) {
        error("failed to mmap huge page");
    }

    // never swap out DMA memory
    if (mlock(virt_addr, size) == -1) {
        error("disable swap for DMA memory");
    }

    // don't keep it around in the hugetlbfs
    close(fd);
    unlink(path.c_str());

    return (dma_memory{virt_addr, virt_to_phys(virt_addr)});
}